

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestPipe::~TestPipe(TestPipe *this)

{
  TestPipe *this_local;
  
  (this->super_BufferedInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__TestPipe_0058cb48;
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0058cb88;
  std::__cxx11::string::~string((string *)&this->data);
  kj::OutputStream::~OutputStream(&this->super_OutputStream);
  kj::BufferedInputStream::~BufferedInputStream(&this->super_BufferedInputStream);
  return;
}

Assistant:

~TestPipe() {}